

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O1

type __thiscall
llvm::yaml::
yamlize<std::vector<llvm::StringRef,std::allocator<llvm::StringRef>>,llvm::yaml::EmptyContext>
          (yaml *this,IO *io,vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *Seq,
          bool param_3,EmptyContext *Ctx)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  undefined7 in_register_00000009;
  ulong uVar4;
  undefined8 local_40;
  void *SaveInfo;
  
  SaveInfo = (void *)CONCAT71(in_register_00000009,param_3);
  uVar2 = (**(code **)(*(long *)this + 0x18))();
  cVar1 = (**(code **)(*(long *)this + 0x10))(this);
  uVar3 = (uint)((ulong)((long)io->Ctxt - (long)io->_vptr_IO) >> 4);
  if (cVar1 == '\0') {
    uVar3 = uVar2;
  }
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      cVar1 = (**(code **)(*(long *)this + 0x20))(this,uVar4 & 0xffffffff,&local_40);
      if (cVar1 != '\0') {
        if ((ulong)((long)io->Ctxt - (long)io->_vptr_IO >> 4) <= uVar4) {
          std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::resize
                    ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)io,uVar4 + 1);
        }
        yamlize<llvm::StringRef>
                  (this,(IO *)(io->_vptr_IO + uVar4 * 2),(StringRef *)0x1,SUB81(SaveInfo,0),Ctx);
        (**(code **)(*(long *)this + 0x28))(this,local_40);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar3);
  }
  (**(code **)(*(long *)this + 0x30))(this);
  return;
}

Assistant:

typename std::enable_if<has_SequenceTraits<T>::value, void>::type
yamlize(IO &io, T &Seq, bool, Context &Ctx) {
  if ( has_FlowTraits< SequenceTraits<T>>::value ) {
    unsigned incnt = io.beginFlowSequence();
    unsigned count = io.outputting() ? SequenceTraits<T>::size(io, Seq) : incnt;
    for(unsigned i=0; i < count; ++i) {
      void *SaveInfo;
      if ( io.preflightFlowElement(i, SaveInfo) ) {
        yamlize(io, SequenceTraits<T>::element(io, Seq, i), true, Ctx);
        io.postflightFlowElement(SaveInfo);
      }
    }
    io.endFlowSequence();
  }
  else {
    unsigned incnt = io.beginSequence();
    unsigned count = io.outputting() ? SequenceTraits<T>::size(io, Seq) : incnt;
    for(unsigned i=0; i < count; ++i) {
      void *SaveInfo;
      if ( io.preflightElement(i, SaveInfo) ) {
        yamlize(io, SequenceTraits<T>::element(io, Seq, i), true, Ctx);
        io.postflightElement(SaveInfo);
      }
    }
    io.endSequence();
  }
}